

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.h
# Opt level: O0

void __thiscall bandit::reporter::spec::it_skip(spec *this,string *desc)

{
  ostream *poVar1;
  string local_38;
  string *local_18;
  string *desc_local;
  spec *this_local;
  
  local_18 = desc;
  desc_local = (string *)this;
  progress_base::it_skip((progress_base *)this,desc);
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_38,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"- it ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1," ... SKIPPED");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_38);
  std::ostream::flush();
  return;
}

Assistant:

void it_skip(const std::string& desc) override {
        progress_base::it_skip(desc);
        stm_ << indent() << "- it " << desc << " ... SKIPPED" << std::endl;
        stm_.flush();
      }